

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O3

RTPAddress * __thiscall
jrtplib::RTPIPv6Address::CreateCopy(RTPIPv6Address *this,RTPMemoryManager *mgr)

{
  uint16_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  RTPAddress *pRVar5;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    pRVar5 = (RTPAddress *)operator_new(0x20);
  }
  else {
    iVar4 = (*mgr->_vptr_RTPMemoryManager[2])(mgr,0x20,0x17);
    pRVar5 = (RTPAddress *)CONCAT44(extraout_var,iVar4);
  }
  uVar1 = this->port;
  uVar2 = *(undefined8 *)&(this->super_RTPAddress).field_0xc;
  uVar3 = *(undefined8 *)&this->field_0x14;
  pRVar5->addresstype = IPv6Address;
  pRVar5->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013cb30;
  *(undefined8 *)&pRVar5->field_0xc = uVar2;
  *(undefined8 *)((long)&pRVar5[1]._vptr_RTPAddress + 4) = uVar3;
  *(uint16_t *)&pRVar5[1].field_0xc = uVar1;
  return pRVar5;
}

Assistant:

RTPAddress *RTPIPv6Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv6Address *newaddr = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(ip,port);
	return newaddr;
}